

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int g_write(lua_State *L,FILE *f,int arg)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *buff_00;
  size_t sVar4;
  long n;
  size_t len;
  char buff [64];
  ulong local_90;
  int local_84;
  FILE *local_80;
  char local_78 [72];
  
  local_80 = (FILE *)f;
  iVar1 = lua_gettop(L);
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (iVar1 != arg) {
    n = 0;
    local_84 = iVar1;
    do {
      buff_00 = local_78;
      uVar2 = lua_numbertocstring(L,arg,buff_00);
      local_90 = (ulong)uVar2;
      if (uVar2 == 0) {
        buff_00 = luaL_checklstring(L,arg,&local_90);
      }
      else {
        local_90 = local_90 - 1;
      }
      sVar4 = fwrite(buff_00,1,local_90,local_80);
      n = n + sVar4;
      if (sVar4 < local_90) {
        iVar1 = luaL_fileresult(L,0,(char *)0x0);
        lua_pushinteger(L,n);
        return iVar1 + 1;
      }
      arg = arg + 1;
    } while (local_84 != arg);
  }
  return 1;
}

Assistant:

static int g_write (lua_State *L, FILE *f, int arg) {
  int nargs = lua_gettop(L) - arg;
  size_t totalbytes = 0;  /* total number of bytes written */
  errno = 0;
  for (; nargs--; arg++) {  /* for each argument */
    char buff[LUA_N2SBUFFSZ];
    const char *s;
    size_t numbytes;  /* bytes written in one call to 'fwrite' */
    size_t len = lua_numbertocstring(L, arg, buff);  /* try as a number */
    if (len > 0) {  /* did conversion work (value was a number)? */
      s = buff;
      len--;
    }
    else  /* must be a string */
      s = luaL_checklstring(L, arg, &len);
    numbytes = fwrite(s, sizeof(char), len, f);
    totalbytes += numbytes;
    if (numbytes < len) {  /* write error? */
      int n = luaL_fileresult(L, 0, NULL);
      lua_pushinteger(L, cast_st2S(totalbytes));
      return n + 1;  /* return fail, error msg., error code, and counter */
    }
  }
  return 1;  /* no errors; file handle already on stack top */
}